

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O1

void __thiscall TPZGenPartialGrid::SetBC(TPZGenPartialGrid *this,TPZGeoMesh *g,int side,int bc)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  TPZVec<long> cornernodes;
  TPZStack<TPZGeoEl_*,_10> ElementVec;
  TPZStack<int,_10> Sides;
  TPZVec<long> local_100;
  TPZGeoElBC local_e0;
  TPZStack<TPZGeoEl_*,_10> local_d8;
  TPZManVector<int,_10> local_68;
  
  switch(side) {
  case 0:
    if (*(this->fRangey).fStore != 0) {
      return;
    }
    if (side != 3) {
      if (side != 2) {
        if (side != 1) goto switchD_013c7d4b_default;
        goto switchD_013c7d4b_caseD_1;
      }
      goto switchD_013c7d4b_caseD_2;
    }
    break;
  case 1:
switchD_013c7d4b_caseD_1:
    if ((this->fRangex).fStore[1] != *(this->fNx).fStore) {
      return;
    }
    if (side != 3) {
      if (side != 2) goto switchD_013c7d4b_default;
      goto switchD_013c7d4b_caseD_2;
    }
    break;
  case 2:
switchD_013c7d4b_caseD_2:
    if ((this->fRangey).fStore[1] != (this->fNx).fStore[1]) {
      return;
    }
    if (side != 3) goto switchD_013c7d4b_default;
    break;
  case 3:
    break;
  default:
    goto switchD_013c7d4b_default;
  }
  if (*(this->fRangex).fStore != 0) {
    return;
  }
switchD_013c7d4b_default:
  TPZStack<TPZGeoEl_*,_10>::TPZStack(&local_d8);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_68);
  TPZVec<long>::TPZVec(&local_100,4);
  piVar3 = (this->fRangex).fStore;
  iVar1 = *piVar3;
  piVar4 = (this->fRangey).fStore;
  iVar6 = *(this->fNx).fStore + 1;
  iVar7 = *piVar4 * iVar6;
  *local_100.fStore = (long)(iVar7 + iVar1);
  iVar2 = piVar3[1];
  local_100.fStore[1] = (long)(iVar7 + iVar2);
  iVar6 = iVar6 * piVar4[1];
  local_100.fStore[2] = (long)(iVar2 + iVar6);
  local_100.fStore[3] = (long)(iVar6 + iVar1);
  uVar5 = side + 4;
  if (-1 < (int)(side + 1U)) {
    uVar5 = side + 1U;
  }
  TPZGeoMesh::GetBoundaryElements
            (g,local_100.fStore[side],local_100.fStore[(int)((side - (uVar5 & 0xfffffffc)) + 1)],
             &local_d8,(TPZStack<int,_10> *)&local_68);
  if (0 < local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNElements) {
    lVar8 = 0;
    do {
      if (local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore[lVar8] !=
          (TPZGeoEl *)0x0) {
        TPZGeoElBC::TPZGeoElBC
                  (&local_e0,
                   local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore
                   [lVar8],local_68.super_TPZVec<int>.fStore[lVar8],bc);
      }
      lVar8 = lVar8 + 1;
    } while (local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNElements !=
             lVar8);
  }
  local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_100.fStore != (long *)0x0) {
    operator_delete__(local_100.fStore);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_68);
  if (local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore ==
      local_d8.super_TPZManVector<TPZGeoEl_*,_10>.fExtAlloc) {
    local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore = (TPZGeoEl **)0x0;
  }
  local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNAlloc = 0;
  local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0183b770;
  if (local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore !=
      (TPZGeoEl **)0x0) {
    operator_delete__(local_d8.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore);
  }
  return;
}

Assistant:

void TPZGenPartialGrid::SetBC(TPZGeoMesh &g, int side, int bc) {
	if(side == 0 && fRangey[0] != 0) return;
	if(side == 1 && fRangex[1] != fNx[0]) return;
	if(side == 2 && fRangey[1] != fNx[1]) return;
	if(side == 3 && fRangex[0] != 0) return;
	TPZStack<TPZGeoEl*> ElementVec;
	TPZStack<int> Sides;
	TPZVec<int64_t> cornernodes(4);
	cornernodes[0] = NodeIndex(fRangex[0],fRangey[0]);
	cornernodes[1] = NodeIndex(fRangex[1],fRangey[0]);
	cornernodes[2] = NodeIndex(fRangex[1],fRangey[1]);
	cornernodes[3] = NodeIndex(fRangex[0],fRangey[1]);
	g.GetBoundaryElements(cornernodes[side],cornernodes[(side+1)%4],ElementVec, Sides);
	int64_t numel = ElementVec.NElements();
	for(int64_t el=0; el<numel; el++) {
		TPZGeoEl *gel = (TPZGeoEl *) ElementVec[el];
		if(gel) {
			TPZGeoElBC(gel,Sides[el],bc);
		}
	}
}